

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_mmu_init(CPUTLBDesc_conflict *desc,CPUTLBDescFast *fast,int64_t now)

{
  CPUTLBEntry *pCVar1;
  CPUIOTLBEntry *pCVar2;
  size_t n_entries;
  int64_t now_local;
  CPUTLBDescFast *fast_local;
  CPUTLBDesc_conflict *desc_local;
  
  tlb_window_reset(desc,now,0);
  desc->n_used_entries = 0;
  fast->mask = 0x3fc0;
  pCVar1 = (CPUTLBEntry *)g_malloc_n(0x100,0x40);
  fast->table = pCVar1;
  pCVar2 = (CPUIOTLBEntry *)g_malloc_n(0x100,0x10);
  desc->iotlb = pCVar2;
  tlb_mmu_flush_locked(desc,fast);
  return;
}

Assistant:

static void tlb_mmu_init(CPUTLBDesc *desc, CPUTLBDescFast *fast, int64_t now)
{
    size_t n_entries = 1 << CPU_TLB_DYN_DEFAULT_BITS;

    tlb_window_reset(desc, now, 0);
    desc->n_used_entries = 0;
    fast->mask = (n_entries - 1) << CPU_TLB_ENTRY_BITS;
    fast->table = g_new(CPUTLBEntry, n_entries);
    desc->iotlb = g_new(CPUIOTLBEntry, n_entries);
    tlb_mmu_flush_locked(desc, fast);
}